

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

void lanli_escape_html(lanli_buffer *ob,uint8_t *data,size_t size)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = 0;
  do {
    bVar4 = uVar3 < size;
    sVar2 = uVar3;
    if ((bVar4) && (uVar1 = uVar3, ""[data[uVar3]] == '\0')) {
      do {
        uVar1 = uVar1 + 1;
        sVar2 = size;
        if (size == uVar1) break;
        sVar2 = uVar1;
      } while (""[data[uVar1]] == '\0');
      bVar4 = uVar1 < size;
    }
    if (!(bool)(uVar3 != 0 | bVar4)) {
      lanli_buffer_put(ob,data,size);
      return;
    }
    if (uVar3 <= sVar2 && sVar2 - uVar3 != 0) {
      lanli_buffer_put(ob,data + uVar3,sVar2 - uVar3);
    }
    if (!bVar4) {
      return;
    }
    lanli_buffer_puts(ob,HTML_ESCAPES_rel + *(int *)(HTML_ESCAPES_rel + (ulong)""[data[sVar2]] * 4))
    ;
    uVar3 = sVar2 + 1;
  } while( true );
}

Assistant:

void lanli_escape_html(lanli_buffer *ob, const uint8_t *data, size_t size) {
  size_t i = 0, mark;

  while (1) {
    mark = i;
    while (i < size && HTML_ESCAPE_TABLE[data[i]] == 0) i++;

    /* Optimization for cases where there's nothing to escape */
    if (mark == 0 && i >= size) {
      lanli_buffer_put(ob, data, size);
      return;
    }

    if (likely(i > mark))
      lanli_buffer_put(ob, data + mark, i - mark);

    if (i >= size) break;

    lanli_buffer_puts(ob, HTML_ESCAPES[HTML_ESCAPE_TABLE[data[i]]]);
    i++;
  }
}